

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsPrivateSetProperty(JsValueRef object,JsValueRef key,JsValueRef value)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  bool bVar2;
  JsErrorCode exitStatus;
  BOOL BVar3;
  JsrtContext *currentContext;
  RecyclableObject *pRVar4;
  DynamicObject *this;
  JavascriptArray *objArray;
  ArrayObject *instance;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus != JsNoError) goto LAB_003b4380;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTSetIndex
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,object,key,value);
  }
  if (object == (JsValueRef)0x0) {
LAB_003b4360:
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    BVar3 = Js::JavascriptOperators::IsObject(object);
    if (BVar3 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b436e;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      if (key == (JsValueRef)0x0) goto LAB_003b4360;
      if ((ulong)key >> 0x30 == 0) {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(key);
        pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          exitStatus = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b436e;
          key = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
        }
      }
      exitStatus = JsErrorInvalidArgument;
      if (value != (JsValueRef)0x0) {
        if (value < &DAT_1000000000000) {
          pRVar4 = Js::VarTo<Js::RecyclableObject>(value);
          pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            exitStatus = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b436e;
            value = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
          }
        }
        this = Js::VarTo<Js::DynamicObject>(object);
        bVar2 = Js::DynamicObject::HasObjectArray(this);
        if (!bVar2) {
          objArray = Js::JavascriptLibrary::CreateArray
                               ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          Js::DynamicObject::SetObjectArray(this,&objArray->super_ArrayObject);
        }
        instance = Js::DynamicObject::GetObjectArray(this);
        exitStatus = JsNoError;
        Js::JavascriptOperators::OP_SetElementI
                  (instance,key,value,scriptContext,PropertyOperation_None);
      }
    }
  }
LAB_003b436e:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_003b4380:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsPrivateSetProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_ JsValueRef value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetIndex, object, key, value);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);

        if (!dynObj->HasObjectArray())
        {
            Js::ArrayObject* objArray = scriptContext->GetLibrary()->CreateArray();
            dynObj->SetObjectArray(objArray);
        }
        Js::JavascriptOperators::OP_SetElementI(dynObj->GetObjectArray(), key, value, scriptContext);

        return JsNoError;
    });
}